

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

idx_t __thiscall duckdb::LocalFileSystem::SeekPosition(LocalFileSystem *this,FileHandle *handle)

{
  int iVar1;
  idx_t iVar2;
  IOException *this_00;
  allocator local_39;
  string local_38;
  
  iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x24])();
  if ((char)iVar1 != '\0') {
    iVar2 = GetFilePointer(this,handle);
    return iVar2;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Cannot seek in files of this type",&local_39);
  IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t LocalFileSystem::SeekPosition(FileHandle &handle) {
	if (!CanSeek()) {
		throw IOException("Cannot seek in files of this type");
	}
	return GetFilePointer(handle);
}